

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_5,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  VecAccess<float,_4,_3> local_78;
  Mat2 local_60;
  Vector<float,_3> local_50 [2];
  undefined1 local_38 [8];
  Type in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((MatrixCaseUtils *)(in1.m_data.m_data + 1),evalCtx,0);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,5>
              ((MatrixCaseUtils *)(in1.m_data.m_data + 1),evalCtx,0);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((MatrixCaseUtils *)local_38,evalCtx,1);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,5>
              ((MatrixCaseUtils *)local_38,evalCtx,1);
  }
  tcu::operator/((tcu *)&local_60,(Matrix<float,_2,_2> *)(in1.m_data.m_data + 1),
                 (Matrix<float,_2,_2> *)local_38);
  reduceToVec3((MatrixCaseUtils *)local_50,&local_60);
  tcu::Vector<float,_4>::xyz(&local_78,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,local_50);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_60);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_38);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(in1.m_data.m_data + 1));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}